

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserUtils.cpp
# Opt level: O2

ParserString GeneratedSaxParser::Utils::toStringListItem(ParserChar **buffer,bool *failed)

{
  byte *pbVar1;
  bool bVar2;
  byte *pbVar3;
  byte *pbVar4;
  size_t sVar5;
  byte bVar6;
  ParserString PVar7;
  
  pbVar4 = (byte *)*buffer;
  if (pbVar4 == (byte *)0x0) {
    *failed = true;
    return (UnionString)ZEXT816(0);
  }
  bVar6 = *pbVar4;
  if (bVar6 == 0) {
    *failed = true;
  }
  else {
    do {
      if ((0x20 < bVar6) || ((0x100002600U >> ((ulong)bVar6 & 0x3f) & 1) == 0)) {
        pbVar3 = (byte *)0x0;
        sVar5 = 0;
        bVar2 = false;
        goto LAB_00841205;
      }
      bVar6 = pbVar4[1];
      pbVar4 = pbVar4 + 1;
    } while (bVar6 != 0);
    *failed = true;
    *buffer = (ParserChar *)pbVar4;
  }
LAB_008411f2:
  pbVar3 = (byte *)0x0;
  sVar5 = 0;
LAB_008411f6:
  PVar7.super_UnionString.length = sVar5;
  PVar7.super_UnionString.str = (ParserChar *)pbVar3;
  return (ParserString)PVar7.super_UnionString;
LAB_00841205:
  pbVar1 = pbVar4 + sVar5;
  if (bVar6 < 0x21) {
    if ((0x100002600U >> ((ulong)bVar6 & 0x3f) & 1) != 0) {
      if (!bVar2) goto LAB_00841254;
      *buffer = (ParserChar *)pbVar1;
      *failed = false;
      goto LAB_008411f6;
    }
    if ((ulong)bVar6 == 0) goto LAB_00841246;
  }
  if (!bVar2) {
    bVar2 = true;
    pbVar3 = pbVar1;
  }
  bVar6 = pbVar4[sVar5 + 1];
  sVar5 = sVar5 + 1;
  goto LAB_00841205;
LAB_00841246:
  if (bVar2) {
    *failed = false;
    *buffer = (ParserChar *)pbVar1;
    goto LAB_008411f6;
  }
LAB_00841254:
  *failed = true;
  *buffer = (ParserChar *)pbVar1;
  goto LAB_008411f2;
}

Assistant:

ParserString Utils::toStringListItem(const ParserChar** buffer, bool& failed)
    {
        ParserString value;

        const ParserChar* s = *buffer;
        if ( !s )
        {
            failed = true;
            return value;
        }

        if ( *s == '\0' )
        {
            failed = true;
            *buffer = s;
            return value;
        }

        // Skip leading white spaces
        while ( isWhiteSpace(*s) )
        {
            ++s;
            if ( *s == '\0' )
            {
                failed = true;
                *buffer = s;
                return value;
            }
        }

        bool characterFound = false;
        while (true)
        {
            if ( *s == '\0' )
            {
                if (characterFound)
                {
                    failed = false;
                    *buffer = s;
                    return value;
                }
                else
                {
                    failed = true;
                    *buffer = s;
                    value.str = 0;
                    value.length = 0;
                    return value;
                }
            }

            if ( !isWhiteSpace(*s) )
            {
                if (!characterFound)
                {
                    value.str = s;
                    characterFound = true;
                }
                value.length++;
            }
            else
                break;
            ++s;
        }
        if ( characterFound )
        {
            *buffer = s;
            failed = false;
            return value;
        }
        else
        {
            failed = true;
            *buffer = s;
            value.str = 0;
            value.length = 0;
            return value;
        }
    }